

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall Logger::flush(Logger *this)

{
  std::mutex::lock(&this->l_mutex);
  fflush((FILE *)this->l_fp);
  pthread_mutex_unlock((pthread_mutex_t *)&this->l_mutex);
  return;
}

Assistant:

void Logger::flush(void)
{
    lock_guard<mutex> lck (l_mutex);
    fflush(l_fp);
}